

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

void __thiscall async_unit_test::binder::~binder(binder *this)

{
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x10ef5e)
  ;
  return;
}

Assistant:

void operator()(cppcms::http::context::completion_type ct)
		{
			std::cout << "Async IO Completed " << std::endl;
			if(ct == cppcms::http::context::operation_aborted) {
				std::cout << "Async Disconned as expected" << std::endl;
				bad_count++;
				return;
			}
			if(counter > 0) {
				counter --;
				std::ostream &out = context->response().out();
				for(unsigned i=0;i<1000;i++) {
					out << i << '\n';
				}
				context->async_flush_output(*this);
			}
			else {
				std::cout << "Async Not disconnected!" << std::endl;
				context->async_complete_response();
			}
		}